

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnOpcodeIndex
          (BinaryReaderObjdumpDisassemble *this,Index value)

{
  size_type sVar1;
  bool bVar2;
  Enum EVar3;
  size_type sVar4;
  const_pointer pcVar5;
  string_view sVar6;
  byte local_79;
  byte local_59;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined1 local_38 [8];
  string_view name;
  Offset immediate_len;
  Index value_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  name.size_ = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.
                super_BinaryReaderDelegate.state)->offset - this->current_opcode_offset;
  string_view::string_view((string_view *)local_38);
  EVar3 = Opcode::operator_cast_to_Enum(&this->current_opcode);
  local_59 = 0;
  if (EVar3 == Call) {
    sVar6 = anon_unknown_16::BinaryReaderObjdumpBase::GetFunctionName
                      (&this->super_BinaryReaderObjdumpBase,value);
    local_48 = sVar6.data_;
    local_38 = (undefined1  [8])local_48;
    local_40 = (char *)sVar6.size_;
    name.data_ = local_40;
    bVar2 = string_view::empty((string_view *)local_38);
    local_59 = bVar2 ^ 0xff;
  }
  sVar1 = name.size_;
  if ((local_59 & 1) != 0) {
    sVar4 = string_view::length((string_view *)local_38);
    pcVar5 = string_view::data((string_view *)local_38);
    LogOpcode(this,sVar1,"%d <%.*s>",(ulong)value,sVar4 & 0xffffffff,pcVar5);
    goto LAB_0015a797;
  }
  EVar3 = Opcode::operator_cast_to_Enum(&this->current_opcode);
  if (EVar3 == GlobalGet) {
LAB_0015a6f6:
    sVar6 = anon_unknown_16::BinaryReaderObjdumpBase::GetGlobalName
                      (&this->super_BinaryReaderObjdumpBase,value);
    local_58 = sVar6.data_;
    local_38 = (undefined1  [8])local_58;
    local_50 = (char *)sVar6.size_;
    name.data_ = local_50;
    bVar2 = string_view::empty((string_view *)local_38);
    local_79 = bVar2 ^ 0xff;
  }
  else {
    EVar3 = Opcode::operator_cast_to_Enum(&this->current_opcode);
    local_79 = 0;
    if (EVar3 == GlobalSet) goto LAB_0015a6f6;
  }
  sVar1 = name.size_;
  if ((local_79 & 1) == 0) {
    LogOpcode(this,name.size_,"%d",(ulong)value);
  }
  else {
    sVar4 = string_view::length((string_view *)local_38);
    pcVar5 = string_view::data((string_view *)local_38);
    LogOpcode(this,sVar1,"%d <%.*s>",(ulong)value,sVar4 & 0xffffffff,pcVar5);
  }
LAB_0015a797:
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnOpcodeIndex(Index value) {
  Offset immediate_len = state->offset - current_opcode_offset;
  string_view name;
  if (current_opcode == Opcode::Call &&
      !(name = GetFunctionName(value)).empty()) {
    LogOpcode(immediate_len, "%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else if ((current_opcode == Opcode::GlobalGet ||
              current_opcode == Opcode::GlobalSet) &&
             !(name = GetGlobalName(value)).empty()) {
    LogOpcode(immediate_len, "%d <" PRIstringview ">", value,
              WABT_PRINTF_STRING_VIEW_ARG(name));
  } else {
    LogOpcode(immediate_len, "%d", value);
  }
  return Result::Ok;
}